

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_TypeDoesNotLookLikeIdentifier_Test>
::~ParameterizedTestFactory
          (ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_TypeDoesNotLookLikeIdentifier_Test>
           *this)

{
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_01606c58;
  std::__cxx11::string::~string((string *)&this->parameter_);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter)
      : parameter_(parameter) {}